

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_byte_array_len_decode
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  int local_40;
  int local_3c;
  int32_t one;
  int32_t len;
  int *out_size_local;
  char *out_local;
  cram_block *in_local;
  cram_codec *c_local;
  cram_slice *slice_local;
  
  local_40 = 1;
  _one = out_size;
  out_size_local = (int *)out;
  out_local = (char *)in;
  in_local = (cram_block *)c;
  c_local = (cram_codec *)slice;
  (*((c->field_6).byte_array_len.len_codec)->decode)
            (slice,(c->field_6).byte_array_len.len_codec,in,(char *)&local_3c,&local_40);
  if (*(long *)&in_local->bit == 0) {
    slice_local._4_4_ = -1;
  }
  else {
    (**(code **)(*(long *)&in_local->bit + 0x18))
              (c_local,*(undefined8 *)&in_local->bit,out_local,out_size_local,&local_3c);
    *_one = local_3c;
    slice_local._4_4_ = 0;
  }
  return slice_local._4_4_;
}

Assistant:

int cram_byte_array_len_decode(cram_slice *slice, cram_codec *c,
			       cram_block *in, char *out,
			       int *out_size) {
    /* Fetch length */
    int32_t len, one = 1;

    c->byte_array_len.len_codec->decode(slice, c->byte_array_len.len_codec, in, (char *)&len, &one);
    //printf("ByteArray Len=%d\n", len);

    if (c->byte_array_len.value_codec) {
	c->byte_array_len.value_codec->decode(slice,
					      c->byte_array_len.value_codec,
					      in, out, &len);
    } else {
	return -1;
    }

    *out_size = len;

    return 0;
}